

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# devices.cc
# Opt level: O0

void __thiscall cnn::Device_CPU::~Device_CPU(Device_CPU *this)

{
  undefined8 *in_RDI;
  
  *in_RDI = &PTR__Device_CPU_007f5af0;
  CPUAllocator::~CPUAllocator((CPUAllocator *)0x6d345a);
  Device::~Device((Device *)0x6d3464);
  return;
}

Assistant:

Device_CPU::~Device_CPU() {}